

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O3

void pnga_update1_ghosts(Integer g_a)

{
  long lVar1;
  short sVar2;
  ushort uVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  C_Integer *pCVar7;
  global_array_t *pgVar8;
  int _d;
  int iVar9;
  Integer proc;
  logical lVar10;
  long lVar11;
  long lVar12;
  size_t sVar13;
  Integer IVar14;
  Integer IVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  C_Integer CVar24;
  Integer _last;
  long lVar25;
  ulong uVar26;
  long lVar27;
  int _ndim_4;
  ulong uVar28;
  long lVar29;
  long lVar30;
  int _ndim;
  Integer np;
  int _index [7];
  Integer _hi [7];
  Integer shi_rem [7];
  Integer slo_rem [7];
  int count [7];
  int stride_rem [7];
  int stride_loc [7];
  Integer plo_rem [7];
  Integer plo_loc [7];
  char err_string [256];
  Integer lo_rem [7];
  Integer dims [7];
  Integer phi_rem [7];
  Integer thi_rem [7];
  Integer hi_rem [7];
  Integer tlo_rem [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer width [7];
  Integer increment [7];
  int local_6b8;
  int local_6b0;
  long local_688;
  uint local_67c;
  ulong local_678;
  Integer local_670;
  int local_668 [10];
  long local_640;
  Integer *local_638;
  int local_62c;
  long local_628 [7];
  long local_5f0;
  long local_5e8;
  long local_5e0;
  Integer *local_5d8;
  long local_5d0;
  ulong local_5c8;
  long local_5c0;
  long local_5b8;
  char **local_5b0;
  long local_5a8;
  int local_59c;
  long local_598;
  long local_590;
  ulong local_588 [8];
  Integer local_548 [8];
  int local_508 [8];
  int local_4e8 [8];
  int local_4c8 [8];
  long alStack_4a8 [7];
  long local_470 [9];
  long local_428;
  undefined7 uStack_420;
  undefined1 uStack_419;
  undefined7 uStack_418;
  long alStack_328 [8];
  ulong auStack_2e8 [8];
  long alStack_2a8 [8];
  Integer local_268 [8];
  ulong auStack_228 [8];
  Integer local_1e8 [8];
  ulong local_1a8 [8];
  Integer local_168 [8];
  long local_128 [8];
  long local_e8 [8];
  ulong auStack_a8 [8];
  long alStack_68 [7];
  
  proc = pnga_nodeid();
  lVar10 = pnga_has_ghosts(g_a);
  IVar15 = GAnproc;
  if (lVar10 != 0) {
    local_5d8 = (Integer *)malloc(GAnproc * 0x70 | 8);
    if (local_5d8 == (Integer *)0x0) {
      pnga_error("pnga_update1_ghosts:malloc failed (_ga_map)",0);
      IVar15 = GAnproc;
    }
    lVar1 = g_a + 1000;
    local_638 = (Integer *)malloc(IVar15 << 3);
    if (local_638 == (Integer *)0x0) {
      pnga_error("pnga_update1_ghosts:malloc failed (_ga_proclist)",0);
    }
    iVar20 = GA[lVar1].elemsize;
    sVar2 = GA[lVar1].ndim;
    lVar30 = (long)sVar2;
    local_59c = GA[lVar1].corner_flag;
    lVar25 = (long)GA[lVar1].p_handle;
    pnga_distribution(g_a,proc,local_168,(Integer *)local_1a8);
    if (0 < lVar30) {
      local_470[0] = 1;
      lVar21 = 0;
      do {
        alStack_68[lVar21] = 0;
        auStack_a8[lVar21] = GA[g_a + 1000].width[lVar21];
        auStack_2e8[lVar21] = GA[g_a + 1000].dims[lVar21];
        if ((local_168[lVar21] == 0) && (local_1a8[lVar21] == 0xffffffffffffffff)) {
          local_470[0] = 0;
        }
        lVar21 = lVar21 + 1;
      } while (lVar30 != lVar21);
      if (0 < sVar2) {
        local_6b0 = (int)proc;
        local_5e8 = (long)local_6b0;
        local_5c0 = lVar30 + -1;
        local_598 = 1;
        if (1 < local_5c0) {
          local_598 = local_5c0;
        }
        local_5f0 = g_a * 0x368 + 0xd5068;
        local_5e0 = g_a * 0x368 + 0xd4f00;
        lVar29 = 0;
        lVar21 = 0;
        local_62c = iVar20;
        local_590 = lVar25;
        IVar15 = g_a;
        local_670 = g_a;
        do {
          local_678 = auStack_a8[lVar29];
          if ((local_678 != 0) && (local_470[0] != 0)) {
            lVar11 = 0;
            do {
              while (lVar11 != lVar29) {
                alStack_328[lVar11] = local_168[lVar11];
                auStack_228[lVar11] = local_1a8[lVar11];
LAB_0017c2d2:
                lVar11 = lVar11 + 1;
                if (lVar11 == lVar30) {
                  if (lVar21 < 1) goto LAB_0017d06a;
                  goto LAB_0017c2e3;
                }
              }
              lVar21 = local_168[lVar29];
              auStack_228[lVar29] = lVar21 - 1;
              alStack_328[lVar29] = lVar21 - local_678;
              if (lVar21 - local_678 == 0 || lVar21 < (long)local_678) {
                lVar21 = (ulong)(1 < lVar21) + 1;
                goto LAB_0017c2d2;
              }
              lVar11 = lVar11 + 1;
              lVar21 = 1;
            } while (lVar11 != lVar30);
LAB_0017c2e3:
            lVar11 = 0;
            local_640 = lVar21;
            do {
              lVar12 = 0;
              do {
                if (lVar29 == lVar12 && lVar21 == 2) {
                  if (lVar11 == 0) {
                    local_548[lVar29] = 1;
LAB_0017c36d:
                    uVar19 = auStack_228[lVar29];
                  }
                  else {
                    uVar19 = auStack_2e8[lVar29];
                    local_548[lVar29] = alStack_328[lVar29] + uVar19;
                  }
                  local_588[lVar29] = uVar19;
                }
                else if (lVar29 == lVar12) {
                  if (0 < alStack_328[lVar29]) {
                    local_548[lVar29] = alStack_328[lVar29];
                    goto LAB_0017c36d;
                  }
                  local_588[lVar29] = auStack_2e8[lVar29];
                  local_548[lVar29] = (auStack_2e8[lVar29] - local_678) + 1;
                }
                else {
                  local_548[lVar12] = alStack_328[lVar12];
                  local_588[lVar12] = auStack_228[lVar12];
                }
                lVar12 = lVar12 + 1;
              } while (lVar30 != lVar12);
              local_5d0 = lVar11;
              lVar10 = pnga_locate_region(IVar15,local_548,(Integer *)local_588,local_5d8,local_638,
                                          &local_688);
              if (lVar10 == 0) {
                local_428._0_1_ = 'c';
                local_428._1_1_ = 'a';
                local_428._2_1_ = 'n';
                local_428._3_1_ = 'n';
                local_428._4_1_ = 'o';
                local_428._5_1_ = 't';
                local_428._6_1_ = ' ';
                local_428._7_1_ = 'l';
                uStack_420 = 0x7220657461636f;
                uStack_419 = 0x65;
                uStack_418 = 0x203a6e6f6967;
                strcpy((char *)((long)&uStack_418 + 6),GA[lVar1].name);
                sVar13 = strlen((char *)&local_428);
                sprintf((char *)((long)&local_428 + (long)(int)sVar13)," [%ld:%ld ",local_548[0]);
                sVar13 = strlen((char *)&local_428);
                iVar20 = (int)sVar13;
                IVar14 = pnga_ndim(IVar15);
                IVar15 = local_670;
                if (1 < IVar14) {
                  lVar21 = 1;
                  do {
                    sprintf((char *)((long)&local_428 + (long)(int)sVar13),",%ld:%ld ",
                            local_548[lVar21]);
                    sVar13 = strlen((char *)&local_428);
                    iVar20 = (int)sVar13;
                    lVar21 = lVar21 + 1;
                    IVar14 = pnga_ndim(IVar15);
                  } while (lVar21 < IVar14);
                }
                *(undefined2 *)((long)&local_428 + (long)iVar20) = 0x5d;
                pnga_error((char *)&local_428,IVar15);
                lVar21 = local_640;
              }
              if (0 < local_688) {
                lVar11 = 0;
                do {
                  uVar19 = local_638[lVar11];
                  local_5a8 = lVar11;
                  pnga_distribution(IVar15,uVar19,local_1e8,local_268);
                  pgVar8 = GA;
                  lVar25 = 0;
                  do {
                    if (alStack_68[lVar25] == 0) {
                      if (lVar29 == lVar25) {
                        if (local_688 == 1 && lVar21 == 1) {
                          alStack_4a8[lVar29] = (local_268[lVar29] - local_1e8[lVar29]) + 1;
                          alStack_2a8[lVar29] = (local_268[lVar29] - local_1e8[lVar29]) + local_678;
                          local_470[lVar29 + 1] = 0;
                        }
                        else {
                          lVar11 = local_1e8[lVar29];
                          if (lVar11 < local_548[lVar29]) {
                            lVar12 = local_268[lVar29];
                            lVar22 = local_548[lVar29] - lVar12;
                            lVar27 = 0;
                          }
                          else {
                            lVar12 = local_268[lVar29];
                            lVar22 = lVar11 - lVar12;
                            lVar27 = lVar11 - alStack_328[lVar29];
                            if (lVar27 < 0) {
                              lVar27 = lVar27 + auStack_2e8[lVar29];
                            }
                          }
                          uVar28 = 0;
                          if ((long)auStack_2e8[lVar29] <= lVar27) {
                            uVar28 = auStack_2e8[lVar29];
                          }
                          lVar11 = (lVar12 - lVar11) + local_678;
                          alStack_4a8[lVar29] = lVar22 + lVar11;
                          alStack_2a8[lVar29] = lVar11;
                          local_470[lVar29 + 1] = lVar27 - uVar28;
                        }
                      }
                      else {
                        uVar28 = auStack_a8[lVar25];
                        alStack_4a8[lVar25] = uVar28;
                        alStack_2a8[lVar25] = (local_268[lVar25] + uVar28) - local_1e8[lVar25];
                        local_470[lVar25 + 1] = uVar28;
                      }
                    }
                    else {
                      alStack_4a8[lVar25] = 0;
                      alStack_2a8[lVar25] =
                           (alStack_68[lVar25] + local_268[lVar25]) - local_1e8[lVar25];
                      local_470[lVar25 + 1] = 0;
                    }
                    lVar25 = lVar25 + 1;
                  } while (lVar30 != lVar25);
                  uVar3 = GA[lVar1].ndim;
                  uVar28 = (ulong)(short)uVar3;
                  uVar4 = GA[lVar1].distr_type;
                  local_67c = uVar4 - 1;
                  local_5c8 = (ulong)uVar4;
                  if (local_67c < 3) {
                    lVar25 = GA[lVar1].num_blocks[0];
                    lVar21 = local_5e8 % lVar25;
                    local_668[0] = (int)lVar21;
                    if (1 < (short)uVar3) {
                      lVar11 = 0;
                      IVar15 = proc;
                      do {
                        IVar15 = (long)((int)IVar15 - (int)lVar21) / lVar25;
                        lVar25 = GA[g_a + 1000].num_blocks[lVar11 + 1];
                        lVar21 = (long)(int)IVar15 % lVar25;
                        local_668[lVar11 + 1] = (int)lVar21;
                        lVar11 = lVar11 + 1;
                      } while ((uVar28 & 0xffffffff) - 1 != lVar11);
                    }
                    lVar25 = local_5f0;
                    if (0 < (short)uVar3) {
                      lVar21 = 0;
                      do {
                        iVar20 = *(int *)((long)local_668 + lVar21);
                        lVar11 = *(long *)((long)GA->dims + lVar21 * 2 + lVar25 + -0x30);
                        *(long *)((long)&local_428 + lVar21 * 2) = lVar11 * iVar20 + 1;
                        lVar11 = ((long)iVar20 + 1) * lVar11;
                        lVar12 = *(long *)((long)GA + lVar21 * 2 + lVar25 + -0x1f8);
                        if (lVar12 <= lVar11) {
                          lVar11 = lVar12;
                        }
                        *(long *)((long)local_628 + lVar21 * 2) = lVar11;
                        lVar21 = lVar21 + 4;
                      } while ((uVar28 & 0xffffffff) << 2 != lVar21);
                    }
                  }
                  else if (uVar4 == 4) {
                    lVar25 = GA[lVar1].num_blocks[0];
                    lVar21 = local_5e8 % lVar25;
                    local_668[0] = (int)lVar21;
                    if (1 < (short)uVar3) {
                      lVar11 = 0;
                      IVar15 = proc;
                      do {
                        IVar15 = (long)((int)IVar15 - (int)lVar21) / lVar25;
                        lVar25 = GA[g_a + 1000].num_blocks[lVar11 + 1];
                        lVar21 = (long)(int)IVar15 % lVar25;
                        local_668[lVar11 + 1] = (int)lVar21;
                        lVar11 = lVar11 + 1;
                      } while ((uVar28 & 0xffffffff) - 1 != lVar11);
                    }
                    if (0 < (short)uVar3) {
                      pCVar7 = GA[lVar1].mapc;
                      lVar25 = 0;
                      iVar20 = 0;
                      do {
                        iVar17 = *(int *)((long)local_668 + lVar25);
                        lVar11 = (long)iVar20 + (long)iVar17;
                        *(C_Integer *)((long)&local_428 + lVar25 * 2) = pCVar7[lVar11];
                        lVar21 = *(long *)((long)GA[lVar1].num_blocks + lVar25 * 2);
                        if ((long)iVar17 < lVar21 + -1) {
                          lVar11 = pCVar7[lVar11 + 1] + -1;
                        }
                        else {
                          lVar11 = *(long *)((long)GA[lVar1].dims + lVar25 * 2);
                        }
                        *(long *)((long)local_628 + lVar25 * 2) = lVar11;
                        iVar20 = iVar20 + (int)lVar21;
                        lVar25 = lVar25 + 4;
                      } while ((uVar28 & 0xffffffff) << 2 != lVar25);
                    }
                  }
                  else if (uVar4 == 0) {
                    if (GA[lVar1].num_rstrctd == 0) {
                      if (0 < (short)uVar3) {
                        lVar25 = 1;
                        uVar16 = 0;
                        do {
                          lVar25 = lVar25 * GA[g_a + 1000].nblock[uVar16];
                          uVar16 = uVar16 + 1;
                        } while (uVar28 != uVar16);
                        if ((proc < 0) || (lVar25 <= proc)) goto LAB_0017ca06;
                        if (0 < (short)uVar3) {
                          pCVar7 = GA[lVar1].mapc;
                          uVar16 = 0;
                          lVar25 = 0;
                          IVar15 = proc;
                          do {
                            lVar11 = (long)GA[g_a + 1000].nblock[uVar16];
                            lVar21 = IVar15 % lVar11;
                            (&local_428)[uVar16] = pCVar7[lVar21 + lVar25];
                            if (lVar21 == lVar11 + -1) {
                              CVar24 = GA[g_a + 1000].dims[uVar16];
                            }
                            else {
                              CVar24 = pCVar7[lVar21 + lVar25 + 1] + -1;
                            }
                            lVar25 = lVar25 + lVar11;
                            local_628[uVar16] = CVar24;
                            uVar16 = uVar16 + 1;
                            IVar15 = IVar15 / lVar11;
                          } while (uVar28 != uVar16);
                        }
                      }
                    }
                    else if (proc < GA[lVar1].num_rstrctd) {
                      if (0 < (short)uVar3) {
                        lVar25 = 1;
                        uVar16 = 0;
                        do {
                          lVar25 = lVar25 * GA[g_a + 1000].nblock[uVar16];
                          uVar16 = uVar16 + 1;
                        } while (uVar28 != uVar16);
                        if ((proc < 0) || (lVar25 <= proc)) goto LAB_0017ca06;
                        if (0 < (short)uVar3) {
                          pCVar7 = GA[lVar1].mapc;
                          uVar16 = 0;
                          lVar25 = 0;
                          IVar15 = proc;
                          do {
                            lVar11 = (long)GA[g_a + 1000].nblock[uVar16];
                            lVar21 = IVar15 % lVar11;
                            (&local_428)[uVar16] = pCVar7[lVar21 + lVar25];
                            if (lVar21 == lVar11 + -1) {
                              CVar24 = GA[g_a + 1000].dims[uVar16];
                            }
                            else {
                              CVar24 = pCVar7[lVar21 + lVar25 + 1] + -1;
                            }
                            lVar25 = lVar25 + lVar11;
                            local_628[uVar16] = CVar24;
                            uVar16 = uVar16 + 1;
                            IVar15 = IVar15 / lVar11;
                          } while (uVar28 != uVar16);
                        }
                      }
                    }
                    else {
LAB_0017ca06:
                      if (0 < (short)uVar3) {
                        memset(&local_428,0,uVar28 * 8);
                        memset(local_628,0xff,uVar28 * 8);
                      }
                    }
                  }
                  if (uVar28 == 1) {
                    local_e8[0] = (local_628[0] - local_428) + pgVar8[lVar1].width[0] * 2 + 1;
                  }
                  if ((short)uVar3 < 2) {
                    lVar11 = 1;
                    lVar21 = 0;
                  }
                  else {
                    lVar11 = 1;
                    lVar25 = 0;
                    lVar21 = 0;
                    do {
                      lVar21 = lVar21 + local_470[lVar25 + 1] * lVar11;
                      lVar12 = (local_628[lVar25] - (&local_428)[lVar25]) +
                               *(long *)((long)pgVar8->dims + lVar25 * 8 + local_5e0 + -0x30) * 2 +
                               1;
                      local_e8[lVar25] = lVar12;
                      lVar11 = lVar11 * lVar12;
                      lVar25 = lVar25 + 1;
                    } while (uVar28 - 1 != lVar25);
                  }
                  lVar12 = local_470[uVar28];
                  iVar20 = pgVar8[lVar1].elemsize;
                  local_5b8 = (long)iVar20;
                  local_5b0 = pgVar8[lVar1].ptr;
                  pcVar5 = pgVar8[lVar1].ptr[proc];
                  local_6b8 = (int)uVar19;
                  if (local_67c < 3) {
                    lVar25 = pgVar8[lVar1].num_blocks[0];
                    lVar22 = (long)local_6b8 % lVar25;
                    local_668[0] = (int)lVar22;
                    if (1 < (short)uVar3) {
                      lVar27 = 0;
                      uVar16 = uVar19;
                      do {
                        uVar16 = (long)((int)uVar16 - (int)lVar22) / lVar25;
                        lVar25 = pgVar8[g_a + 1000].num_blocks[lVar27 + 1];
                        lVar22 = (long)(int)uVar16 % lVar25;
                        local_668[lVar27 + 1] = (int)lVar22;
                        lVar27 = lVar27 + 1;
                      } while ((uVar28 & 0xffffffff) - 1 != lVar27);
                    }
                    lVar25 = local_5f0;
                    if (0 < (short)uVar3) {
                      lVar22 = 0;
                      do {
                        iVar17 = *(int *)((long)local_668 + lVar22);
                        lVar27 = *(long *)((long)pgVar8->dims + lVar22 * 2 + lVar25 + -0x30);
                        *(long *)((long)&local_428 + lVar22 * 2) = lVar27 * iVar17 + 1;
                        lVar27 = ((long)iVar17 + 1) * lVar27;
                        lVar18 = *(long *)((long)pgVar8 + lVar22 * 2 + lVar25 + -0x1f8);
                        if (lVar18 <= lVar27) {
                          lVar27 = lVar18;
                        }
                        *(long *)((long)local_628 + lVar22 * 2) = lVar27;
                        lVar22 = lVar22 + 4;
                      } while ((uVar28 & 0xffffffff) << 2 != lVar22);
                    }
                  }
                  else if ((int)local_5c8 == 4) {
                    lVar25 = pgVar8[lVar1].num_blocks[0];
                    lVar22 = (long)local_6b8 % lVar25;
                    local_668[0] = (int)lVar22;
                    if (1 < (short)uVar3) {
                      lVar27 = 0;
                      uVar16 = uVar19;
                      do {
                        uVar16 = (long)((int)uVar16 - (int)lVar22) / lVar25;
                        lVar25 = pgVar8[g_a + 1000].num_blocks[lVar27 + 1];
                        lVar22 = (long)(int)uVar16 % lVar25;
                        local_668[lVar27 + 1] = (int)lVar22;
                        lVar27 = lVar27 + 1;
                      } while ((uVar28 & 0xffffffff) - 1 != lVar27);
                    }
                    if (0 < (short)uVar3) {
                      pCVar7 = pgVar8[lVar1].mapc;
                      lVar25 = 0;
                      iVar17 = 0;
                      do {
                        iVar9 = *(int *)((long)local_668 + lVar25);
                        lVar27 = (long)iVar17 + (long)iVar9;
                        *(C_Integer *)((long)&local_428 + lVar25 * 2) = pCVar7[lVar27];
                        lVar22 = *(long *)((long)pgVar8[lVar1].num_blocks + lVar25 * 2);
                        if ((long)iVar9 < lVar22 + -1) {
                          lVar27 = pCVar7[lVar27 + 1] + -1;
                        }
                        else {
                          lVar27 = *(long *)((long)pgVar8[lVar1].dims + lVar25 * 2);
                        }
                        *(long *)((long)local_628 + lVar25 * 2) = lVar27;
                        iVar17 = iVar17 + (int)lVar22;
                        lVar25 = lVar25 + 4;
                      } while ((uVar28 & 0xffffffff) << 2 != lVar25);
                    }
                  }
                  else if ((int)local_5c8 == 0) {
                    if (pgVar8[lVar1].num_rstrctd == 0) {
                      if (0 < (short)uVar3) {
                        lVar25 = 1;
                        uVar16 = 0;
                        do {
                          lVar25 = lVar25 * pgVar8[g_a + 1000].nblock[uVar16];
                          uVar16 = uVar16 + 1;
                        } while (uVar28 != uVar16);
                        if (((long)uVar19 < 0) || (lVar25 <= (long)uVar19)) {
LAB_0017ce51:
                          uVar16 = uVar28;
                          if (0 < (short)uVar3) goto LAB_0017ce5e;
                        }
                        else if (0 < (short)uVar3) {
                          pCVar7 = pgVar8[lVar1].mapc;
                          lVar25 = 0;
                          uVar26 = 0;
                          uVar16 = uVar19;
                          do {
                            lVar27 = (long)pgVar8[g_a + 1000].nblock[uVar26];
                            lVar22 = (long)uVar16 % lVar27;
                            (&local_428)[uVar26] = pCVar7[lVar22 + lVar25];
                            if (lVar22 == lVar27 + -1) {
                              CVar24 = pgVar8[g_a + 1000].dims[uVar26];
                            }
                            else {
                              CVar24 = pCVar7[lVar22 + lVar25 + 1] + -1;
                            }
                            lVar25 = lVar25 + lVar27;
                            local_628[uVar26] = CVar24;
                            uVar26 = uVar26 + 1;
                            uVar16 = (long)uVar16 / lVar27;
                          } while (uVar28 != uVar26);
                        }
                      }
                    }
                    else if ((long)uVar19 < pgVar8[lVar1].num_rstrctd) {
                      if (0 < (short)uVar3) {
                        lVar25 = 1;
                        uVar16 = 0;
                        do {
                          lVar25 = lVar25 * pgVar8[g_a + 1000].nblock[uVar16];
                          uVar16 = uVar16 + 1;
                        } while (uVar28 != uVar16);
                        if (((long)uVar19 < 0) || (lVar25 <= (long)uVar19)) goto LAB_0017ce51;
                        if (0 < (short)uVar3) {
                          pCVar7 = pgVar8[lVar1].mapc;
                          lVar25 = 0;
                          uVar26 = 0;
                          uVar16 = uVar19;
                          do {
                            lVar27 = (long)pgVar8[g_a + 1000].nblock[uVar26];
                            lVar22 = (long)uVar16 % lVar27;
                            (&local_428)[uVar26] = pCVar7[lVar22 + lVar25];
                            if (lVar22 == lVar27 + -1) {
                              CVar24 = pgVar8[g_a + 1000].dims[uVar26];
                            }
                            else {
                              CVar24 = pCVar7[lVar22 + lVar25 + 1] + -1;
                            }
                            lVar25 = lVar25 + lVar27;
                            local_628[uVar26] = CVar24;
                            uVar26 = uVar26 + 1;
                            uVar16 = (long)uVar16 / lVar27;
                          } while (uVar28 != uVar26);
                        }
                      }
                    }
                    else if (0 < (short)uVar3) {
                      uVar16 = (ulong)uVar3;
LAB_0017ce5e:
                      memset(&local_428,0,uVar16 << 3);
                      memset(local_628,0xff,uVar16 << 3);
                    }
                  }
                  lVar25 = local_590;
                  IVar15 = local_670;
                  if (uVar28 == 1) {
                    local_128[0] = (local_628[0] - local_428) + pgVar8[lVar1].width[0] * 2 + 1;
                  }
                  if ((short)uVar3 < 2) {
                    lVar27 = 1;
                    lVar22 = 0;
                  }
                  else {
                    lVar27 = 1;
                    lVar18 = 0;
                    lVar22 = 0;
                    do {
                      lVar22 = lVar22 + alStack_4a8[lVar18] * lVar27;
                      lVar23 = (local_628[lVar18] - (&local_428)[lVar18]) +
                               *(long *)((long)pgVar8->dims + lVar18 * 8 + local_5e0 + -0x30) * 2 +
                               1;
                      local_128[lVar18] = lVar23;
                      lVar27 = lVar27 * lVar23;
                      lVar18 = lVar18 + 1;
                    } while (uVar28 - 1 != lVar18);
                  }
                  lVar18 = alStack_4a8[uVar28 - 1];
                  pcVar6 = local_5b0[uVar19];
                  local_4c8[0] = local_62c;
                  local_4e8[0] = local_62c;
                  if (sVar2 != 1) {
                    lVar23 = 0;
                    iVar17 = local_62c;
                    iVar9 = local_62c;
                    do {
                      iVar17 = iVar17 * (int)local_128[lVar23];
                      local_4e8[lVar23] = iVar17;
                      iVar9 = iVar9 * (int)local_e8[lVar23];
                      local_4c8[lVar23] = iVar9;
                      local_4e8[lVar23 + 1] = iVar17;
                      local_4c8[lVar23 + 1] = iVar9;
                      lVar23 = lVar23 + 1;
                    } while (local_598 != lVar23);
                  }
                  lVar23 = 0;
                  do {
                    local_508[lVar23] = ((int)alStack_2a8[lVar23] - (int)alStack_4a8[lVar23]) + 1;
                    lVar23 = lVar23 + 1;
                  } while (lVar30 != lVar23);
                  local_508[0] = local_508[0] * local_62c;
                  if (-1 < (int)local_590) {
                    uVar19 = (ulong)(uint)PGRP_LIST[local_590].inv_map_proc_list[uVar19];
                  }
                  ARMCI_GetS(pcVar6 + (lVar27 * lVar18 + lVar22) * local_5b8,local_4e8,
                             pcVar5 + (lVar11 * lVar12 + lVar21) * (long)iVar20,local_4c8,local_508,
                             (int)local_5c0,(int)uVar19);
                  lVar11 = local_5a8 + 1;
                  lVar21 = local_640;
                } while (lVar11 < local_688);
              }
              lVar11 = local_5d0 + 1;
            } while (lVar11 != lVar21);
LAB_0017d06a:
            lVar11 = 0;
LAB_0017d06c:
            do {
              if (lVar11 == lVar29) {
                uVar19 = local_1a8[lVar29];
                alStack_328[lVar29] = uVar19 + 1;
                auStack_228[lVar29] = uVar19 + local_678;
                if ((long)(uVar19 + local_678) <= (long)auStack_2e8[lVar29]) {
                  lVar11 = lVar11 + 1;
                  lVar21 = 1;
                  if (lVar11 == lVar30) goto LAB_0017d0f5;
                  goto LAB_0017d06c;
                }
                lVar21 = (ulong)((long)uVar19 < (long)auStack_2e8[lVar29]) + 1;
              }
              else {
                alStack_328[lVar11] = local_168[lVar11];
                auStack_228[lVar11] = local_1a8[lVar11];
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 != lVar30);
            if (0 < lVar21) {
LAB_0017d0f5:
              lVar11 = 0;
              local_640 = lVar21;
              do {
                lVar12 = 0;
                do {
                  if (lVar29 == lVar12 && lVar21 == 2) {
                    if (lVar11 == 0) {
                      local_548[lVar29] = alStack_328[lVar29];
                      uVar19 = auStack_2e8[lVar29];
                    }
                    else {
                      local_548[lVar29] = 1;
                      uVar19 = auStack_228[lVar29] - auStack_2e8[lVar29];
                    }
LAB_0017d1ac:
                    local_588[lVar29] = uVar19;
                  }
                  else {
                    if (lVar29 == lVar12) {
                      uVar19 = auStack_228[lVar29];
                      if ((long)auStack_2e8[lVar29] < (long)uVar19) {
                        local_548[lVar29] = 1;
                        uVar19 = local_678;
                      }
                      else {
                        local_548[lVar29] = alStack_328[lVar29];
                      }
                      goto LAB_0017d1ac;
                    }
                    local_548[lVar12] = alStack_328[lVar12];
                    local_588[lVar12] = auStack_228[lVar12];
                  }
                  lVar12 = lVar12 + 1;
                } while (lVar30 != lVar12);
                local_5d0 = lVar11;
                lVar10 = pnga_locate_region(IVar15,local_548,(Integer *)local_588,local_5d8,
                                            local_638,&local_688);
                if (lVar10 == 0) {
                  local_428._0_1_ = 'c';
                  local_428._1_1_ = 'a';
                  local_428._2_1_ = 'n';
                  local_428._3_1_ = 'n';
                  local_428._4_1_ = 'o';
                  local_428._5_1_ = 't';
                  local_428._6_1_ = ' ';
                  local_428._7_1_ = 'l';
                  uStack_420 = 0x7220657461636f;
                  uStack_419 = 0x65;
                  uStack_418 = 0x203a6e6f6967;
                  strcpy((char *)((long)&uStack_418 + 6),GA[lVar1].name);
                  sVar13 = strlen((char *)&local_428);
                  sprintf((char *)((long)&local_428 + (long)(int)sVar13)," [%ld:%ld ",local_548[0]);
                  sVar13 = strlen((char *)&local_428);
                  iVar20 = (int)sVar13;
                  IVar14 = pnga_ndim(IVar15);
                  IVar15 = local_670;
                  if (1 < IVar14) {
                    lVar21 = 1;
                    do {
                      sprintf((char *)((long)&local_428 + (long)(int)sVar13),",%ld:%ld ",
                              local_548[lVar21]);
                      sVar13 = strlen((char *)&local_428);
                      iVar20 = (int)sVar13;
                      lVar21 = lVar21 + 1;
                      IVar14 = pnga_ndim(IVar15);
                    } while (lVar21 < IVar14);
                  }
                  *(undefined2 *)((long)&local_428 + (long)iVar20) = 0x5d;
                  pnga_error((char *)&local_428,IVar15);
                  lVar21 = local_640;
                }
                if (0 < local_688) {
                  lVar11 = 0;
                  do {
                    uVar19 = local_638[lVar11];
                    local_5a8 = lVar11;
                    pnga_distribution(IVar15,uVar19,local_1e8,local_268);
                    pgVar8 = GA;
                    lVar25 = 0;
                    do {
                      if (alStack_68[lVar25] == 0) {
                        if (lVar29 == lVar25) {
                          if (local_688 == 1 && lVar21 == 1) {
                            uVar28 = auStack_a8[lVar29];
                            alStack_4a8[lVar29] = uVar28;
                            alStack_2a8[lVar29] = uVar28 * 2 + -1;
                            lVar11 = (uVar28 + local_1a8[lVar29]) - local_168[lVar29];
                          }
                          else {
                            uVar28 = local_588[lVar29];
                            if (local_268[lVar29] < (long)local_588[lVar29]) {
                              uVar28 = local_268[lVar29];
                            }
                            lVar11 = ~local_1a8[lVar29] + local_1e8[lVar29];
                            if (lVar11 < 0) {
                              uVar16 = auStack_2e8[lVar29];
                              lVar11 = lVar11 + uVar16;
                            }
                            else {
                              uVar16 = auStack_2e8[lVar29];
                            }
                            uVar26 = 0;
                            if ((long)uVar16 <= lVar11) {
                              uVar26 = uVar16;
                            }
                            uVar16 = auStack_a8[lVar29];
                            alStack_4a8[lVar29] = uVar16;
                            alStack_2a8[lVar29] = (uVar28 - local_1e8[lVar29]) + uVar16;
                            lVar11 = (local_1a8[lVar29] + uVar16 + lVar11) -
                                     (uVar26 + local_168[lVar29]);
                          }
                          local_470[lVar29 + 1] = lVar11 + 1;
                        }
                        else {
                          uVar28 = auStack_a8[lVar25];
                          alStack_4a8[lVar25] = uVar28;
                          alStack_2a8[lVar25] = (local_268[lVar25] + uVar28) - local_1e8[lVar25];
                          local_470[lVar25 + 1] = uVar28;
                        }
                      }
                      else {
                        alStack_4a8[lVar25] = 0;
                        alStack_2a8[lVar25] =
                             (alStack_68[lVar25] + local_268[lVar25]) - local_1e8[lVar25];
                        local_470[lVar25 + 1] = 0;
                      }
                      lVar25 = lVar25 + 1;
                    } while (lVar30 != lVar25);
                    uVar3 = GA[lVar1].ndim;
                    uVar28 = (ulong)(short)uVar3;
                    uVar4 = GA[lVar1].distr_type;
                    local_67c = uVar4 - 1;
                    local_5c8 = (ulong)uVar4;
                    if (local_67c < 3) {
                      lVar25 = GA[lVar1].num_blocks[0];
                      lVar21 = local_5e8 % lVar25;
                      local_668[0] = (int)lVar21;
                      if (1 < (short)uVar3) {
                        lVar11 = 0;
                        IVar15 = proc;
                        do {
                          IVar15 = (long)((int)IVar15 - (int)lVar21) / lVar25;
                          lVar25 = GA[g_a + 1000].num_blocks[lVar11 + 1];
                          lVar21 = (long)(int)IVar15 % lVar25;
                          local_668[lVar11 + 1] = (int)lVar21;
                          lVar11 = lVar11 + 1;
                        } while ((uVar28 & 0xffffffff) - 1 != lVar11);
                      }
                      lVar25 = local_5f0;
                      if (0 < (short)uVar3) {
                        lVar21 = 0;
                        do {
                          iVar20 = *(int *)((long)local_668 + lVar21);
                          lVar11 = *(long *)((long)GA->dims + lVar21 * 2 + lVar25 + -0x30);
                          *(long *)((long)&local_428 + lVar21 * 2) = lVar11 * iVar20 + 1;
                          lVar11 = ((long)iVar20 + 1) * lVar11;
                          lVar12 = *(long *)((long)GA + lVar21 * 2 + lVar25 + -0x1f8);
                          if (lVar12 <= lVar11) {
                            lVar11 = lVar12;
                          }
                          *(long *)((long)local_628 + lVar21 * 2) = lVar11;
                          lVar21 = lVar21 + 4;
                        } while ((uVar28 & 0xffffffff) << 2 != lVar21);
                      }
                    }
                    else if (uVar4 == 4) {
                      lVar25 = GA[lVar1].num_blocks[0];
                      lVar21 = local_5e8 % lVar25;
                      local_668[0] = (int)lVar21;
                      if (1 < (short)uVar3) {
                        lVar11 = 0;
                        IVar15 = proc;
                        do {
                          IVar15 = (long)((int)IVar15 - (int)lVar21) / lVar25;
                          lVar25 = GA[g_a + 1000].num_blocks[lVar11 + 1];
                          lVar21 = (long)(int)IVar15 % lVar25;
                          local_668[lVar11 + 1] = (int)lVar21;
                          lVar11 = lVar11 + 1;
                        } while ((uVar28 & 0xffffffff) - 1 != lVar11);
                      }
                      if (0 < (short)uVar3) {
                        pCVar7 = GA[lVar1].mapc;
                        lVar25 = 0;
                        iVar20 = 0;
                        do {
                          iVar17 = *(int *)((long)local_668 + lVar25);
                          lVar11 = (long)iVar20 + (long)iVar17;
                          *(C_Integer *)((long)&local_428 + lVar25 * 2) = pCVar7[lVar11];
                          lVar21 = *(long *)((long)GA[lVar1].num_blocks + lVar25 * 2);
                          if ((long)iVar17 < lVar21 + -1) {
                            lVar11 = pCVar7[lVar11 + 1] + -1;
                          }
                          else {
                            lVar11 = *(long *)((long)GA[lVar1].dims + lVar25 * 2);
                          }
                          *(long *)((long)local_628 + lVar25 * 2) = lVar11;
                          iVar20 = iVar20 + (int)lVar21;
                          lVar25 = lVar25 + 4;
                        } while ((uVar28 & 0xffffffff) << 2 != lVar25);
                      }
                    }
                    else if (uVar4 == 0) {
                      if (GA[lVar1].num_rstrctd == 0) {
                        if (0 < (short)uVar3) {
                          lVar25 = 1;
                          uVar16 = 0;
                          do {
                            lVar25 = lVar25 * GA[g_a + 1000].nblock[uVar16];
                            uVar16 = uVar16 + 1;
                          } while (uVar28 != uVar16);
                          if ((proc < 0) || (lVar25 <= proc)) goto LAB_0017d81e;
                          if (0 < (short)uVar3) {
                            pCVar7 = GA[lVar1].mapc;
                            lVar25 = 0;
                            uVar16 = 0;
                            IVar15 = proc;
                            do {
                              lVar11 = (long)GA[g_a + 1000].nblock[uVar16];
                              lVar21 = IVar15 % lVar11;
                              (&local_428)[uVar16] = pCVar7[lVar21 + lVar25];
                              if (lVar21 == lVar11 + -1) {
                                CVar24 = GA[g_a + 1000].dims[uVar16];
                              }
                              else {
                                CVar24 = pCVar7[lVar21 + lVar25 + 1] + -1;
                              }
                              lVar25 = lVar25 + lVar11;
                              local_628[uVar16] = CVar24;
                              uVar16 = uVar16 + 1;
                              IVar15 = IVar15 / lVar11;
                            } while (uVar28 != uVar16);
                          }
                        }
                      }
                      else if (proc < GA[lVar1].num_rstrctd) {
                        if (0 < (short)uVar3) {
                          lVar25 = 1;
                          uVar16 = 0;
                          do {
                            lVar25 = lVar25 * GA[g_a + 1000].nblock[uVar16];
                            uVar16 = uVar16 + 1;
                          } while (uVar28 != uVar16);
                          if ((proc < 0) || (lVar25 <= proc)) goto LAB_0017d81e;
                          if (0 < (short)uVar3) {
                            pCVar7 = GA[lVar1].mapc;
                            lVar25 = 0;
                            uVar16 = 0;
                            IVar15 = proc;
                            do {
                              lVar11 = (long)GA[g_a + 1000].nblock[uVar16];
                              lVar21 = IVar15 % lVar11;
                              (&local_428)[uVar16] = pCVar7[lVar21 + lVar25];
                              if (lVar21 == lVar11 + -1) {
                                CVar24 = GA[g_a + 1000].dims[uVar16];
                              }
                              else {
                                CVar24 = pCVar7[lVar21 + lVar25 + 1] + -1;
                              }
                              lVar25 = lVar25 + lVar11;
                              local_628[uVar16] = CVar24;
                              uVar16 = uVar16 + 1;
                              IVar15 = IVar15 / lVar11;
                            } while (uVar28 != uVar16);
                          }
                        }
                      }
                      else {
LAB_0017d81e:
                        if (0 < (short)uVar3) {
                          memset(&local_428,0,uVar28 * 8);
                          memset(local_628,0xff,uVar28 * 8);
                        }
                      }
                    }
                    if (uVar28 == 1) {
                      local_e8[0] = (local_628[0] - local_428) + pgVar8[lVar1].width[0] * 2 + 1;
                    }
                    if ((short)uVar3 < 2) {
                      lVar11 = 1;
                      lVar21 = 0;
                    }
                    else {
                      lVar11 = 1;
                      lVar21 = 0;
                      lVar25 = 0;
                      do {
                        lVar21 = lVar21 + local_470[lVar25 + 1] * lVar11;
                        lVar12 = (local_628[lVar25] - (&local_428)[lVar25]) +
                                 *(long *)((long)pgVar8->dims + lVar25 * 8 + local_5e0 + -0x30) * 2
                                 + 1;
                        local_e8[lVar25] = lVar12;
                        lVar11 = lVar11 * lVar12;
                        lVar25 = lVar25 + 1;
                      } while (uVar28 - 1 != lVar25);
                    }
                    lVar12 = local_470[uVar28];
                    iVar20 = pgVar8[lVar1].elemsize;
                    pcVar5 = pgVar8[lVar1].ptr[proc];
                    local_5b0 = pgVar8[lVar1].ptr;
                    local_5b8 = (long)iVar20;
                    local_6b8 = (int)uVar19;
                    if (local_67c < 3) {
                      lVar25 = pgVar8[lVar1].num_blocks[0];
                      lVar22 = (long)local_6b8 % lVar25;
                      local_668[0] = (int)lVar22;
                      if (1 < (short)uVar3) {
                        lVar27 = 0;
                        uVar16 = uVar19;
                        do {
                          uVar16 = (long)((int)uVar16 - (int)lVar22) / lVar25;
                          lVar25 = pgVar8[g_a + 1000].num_blocks[lVar27 + 1];
                          lVar22 = (long)(int)uVar16 % lVar25;
                          local_668[lVar27 + 1] = (int)lVar22;
                          lVar27 = lVar27 + 1;
                        } while ((uVar28 & 0xffffffff) - 1 != lVar27);
                      }
                      lVar25 = local_5f0;
                      if (0 < (short)uVar3) {
                        lVar22 = 0;
                        do {
                          iVar17 = *(int *)((long)local_668 + lVar22);
                          lVar27 = *(long *)((long)pgVar8->dims + lVar22 * 2 + lVar25 + -0x30);
                          *(long *)((long)&local_428 + lVar22 * 2) = lVar27 * iVar17 + 1;
                          lVar27 = ((long)iVar17 + 1) * lVar27;
                          lVar18 = *(long *)((long)pgVar8 + lVar22 * 2 + lVar25 + -0x1f8);
                          if (lVar18 <= lVar27) {
                            lVar27 = lVar18;
                          }
                          *(long *)((long)local_628 + lVar22 * 2) = lVar27;
                          lVar22 = lVar22 + 4;
                        } while ((uVar28 & 0xffffffff) << 2 != lVar22);
                      }
                    }
                    else if ((int)local_5c8 == 4) {
                      lVar25 = pgVar8[lVar1].num_blocks[0];
                      lVar22 = (long)local_6b8 % lVar25;
                      local_668[0] = (int)lVar22;
                      if (1 < (short)uVar3) {
                        lVar27 = 0;
                        uVar16 = uVar19;
                        do {
                          uVar16 = (long)((int)uVar16 - (int)lVar22) / lVar25;
                          lVar25 = pgVar8[g_a + 1000].num_blocks[lVar27 + 1];
                          lVar22 = (long)(int)uVar16 % lVar25;
                          local_668[lVar27 + 1] = (int)lVar22;
                          lVar27 = lVar27 + 1;
                        } while ((uVar28 & 0xffffffff) - 1 != lVar27);
                      }
                      if (0 < (short)uVar3) {
                        pCVar7 = pgVar8[lVar1].mapc;
                        lVar25 = 0;
                        iVar17 = 0;
                        do {
                          iVar9 = *(int *)((long)local_668 + lVar25);
                          lVar27 = (long)iVar17 + (long)iVar9;
                          *(C_Integer *)((long)&local_428 + lVar25 * 2) = pCVar7[lVar27];
                          lVar22 = *(long *)((long)pgVar8[lVar1].num_blocks + lVar25 * 2);
                          if ((long)iVar9 < lVar22 + -1) {
                            lVar27 = pCVar7[lVar27 + 1] + -1;
                          }
                          else {
                            lVar27 = *(long *)((long)pgVar8[lVar1].dims + lVar25 * 2);
                          }
                          *(long *)((long)local_628 + lVar25 * 2) = lVar27;
                          iVar17 = iVar17 + (int)lVar22;
                          lVar25 = lVar25 + 4;
                        } while ((uVar28 & 0xffffffff) << 2 != lVar25);
                      }
                    }
                    else if ((int)local_5c8 == 0) {
                      if (pgVar8[lVar1].num_rstrctd == 0) {
                        if (0 < (short)uVar3) {
                          lVar25 = 1;
                          uVar16 = 0;
                          do {
                            lVar25 = lVar25 * pgVar8[g_a + 1000].nblock[uVar16];
                            uVar16 = uVar16 + 1;
                          } while (uVar28 != uVar16);
                          if (((long)uVar19 < 0) || (lVar25 <= (long)uVar19)) {
LAB_0017dc69:
                            uVar16 = uVar28;
                            if (0 < (short)uVar3) goto LAB_0017dc76;
                          }
                          else if (0 < (short)uVar3) {
                            pCVar7 = pgVar8[lVar1].mapc;
                            lVar25 = 0;
                            uVar26 = 0;
                            uVar16 = uVar19;
                            do {
                              lVar27 = (long)pgVar8[g_a + 1000].nblock[uVar26];
                              lVar22 = (long)uVar16 % lVar27;
                              (&local_428)[uVar26] = pCVar7[lVar22 + lVar25];
                              if (lVar22 == lVar27 + -1) {
                                CVar24 = pgVar8[g_a + 1000].dims[uVar26];
                              }
                              else {
                                CVar24 = pCVar7[lVar22 + lVar25 + 1] + -1;
                              }
                              lVar25 = lVar25 + lVar27;
                              local_628[uVar26] = CVar24;
                              uVar26 = uVar26 + 1;
                              uVar16 = (long)uVar16 / lVar27;
                            } while (uVar28 != uVar26);
                          }
                        }
                      }
                      else if ((long)uVar19 < pgVar8[lVar1].num_rstrctd) {
                        if (0 < (short)uVar3) {
                          lVar25 = 1;
                          uVar16 = 0;
                          do {
                            lVar25 = lVar25 * pgVar8[g_a + 1000].nblock[uVar16];
                            uVar16 = uVar16 + 1;
                          } while (uVar28 != uVar16);
                          if (((long)uVar19 < 0) || (lVar25 <= (long)uVar19)) goto LAB_0017dc69;
                          if (0 < (short)uVar3) {
                            pCVar7 = pgVar8[lVar1].mapc;
                            lVar25 = 0;
                            uVar26 = 0;
                            uVar16 = uVar19;
                            do {
                              lVar27 = (long)pgVar8[g_a + 1000].nblock[uVar26];
                              lVar22 = (long)uVar16 % lVar27;
                              (&local_428)[uVar26] = pCVar7[lVar22 + lVar25];
                              if (lVar22 == lVar27 + -1) {
                                CVar24 = pgVar8[g_a + 1000].dims[uVar26];
                              }
                              else {
                                CVar24 = pCVar7[lVar22 + lVar25 + 1] + -1;
                              }
                              lVar25 = lVar25 + lVar27;
                              local_628[uVar26] = CVar24;
                              uVar26 = uVar26 + 1;
                              uVar16 = (long)uVar16 / lVar27;
                            } while (uVar28 != uVar26);
                          }
                        }
                      }
                      else if (0 < (short)uVar3) {
                        uVar16 = (ulong)uVar3;
LAB_0017dc76:
                        memset(&local_428,0,uVar16 << 3);
                        memset(local_628,0xff,uVar16 << 3);
                      }
                    }
                    lVar25 = local_590;
                    IVar15 = local_670;
                    if (uVar28 == 1) {
                      local_128[0] = (local_628[0] - local_428) + pgVar8[lVar1].width[0] * 2 + 1;
                    }
                    if ((short)uVar3 < 2) {
                      lVar27 = 1;
                      lVar22 = 0;
                    }
                    else {
                      lVar27 = 1;
                      lVar22 = 0;
                      lVar18 = 0;
                      do {
                        lVar22 = lVar22 + alStack_4a8[lVar18] * lVar27;
                        lVar23 = (local_628[lVar18] - (&local_428)[lVar18]) +
                                 *(long *)((long)pgVar8->dims + lVar18 * 8 + local_5e0 + -0x30) * 2
                                 + 1;
                        local_128[lVar18] = lVar23;
                        lVar27 = lVar27 * lVar23;
                        lVar18 = lVar18 + 1;
                      } while (uVar28 - 1 != lVar18);
                    }
                    lVar18 = alStack_4a8[uVar28 - 1];
                    pcVar6 = local_5b0[uVar19];
                    local_4c8[0] = local_62c;
                    local_4e8[0] = local_62c;
                    if (sVar2 != 1) {
                      lVar23 = 0;
                      iVar17 = local_62c;
                      iVar9 = local_62c;
                      do {
                        iVar17 = iVar17 * (int)local_128[lVar23];
                        local_4e8[lVar23] = iVar17;
                        iVar9 = iVar9 * (int)local_e8[lVar23];
                        local_4c8[lVar23] = iVar9;
                        local_4e8[lVar23 + 1] = iVar17;
                        local_4c8[lVar23 + 1] = iVar9;
                        lVar23 = lVar23 + 1;
                      } while (local_598 != lVar23);
                    }
                    lVar23 = 0;
                    do {
                      local_508[lVar23] = ((int)alStack_2a8[lVar23] - (int)alStack_4a8[lVar23]) + 1;
                      lVar23 = lVar23 + 1;
                    } while (lVar30 != lVar23);
                    local_508[0] = local_508[0] * local_62c;
                    if (-1 < (int)local_590) {
                      uVar19 = (ulong)(uint)PGRP_LIST[local_590].inv_map_proc_list[uVar19];
                    }
                    ARMCI_GetS(pcVar6 + (lVar27 * lVar18 + lVar22) * local_5b8,local_4e8,
                               pcVar5 + (lVar11 * lVar12 + lVar21) * (long)iVar20,local_4c8,
                               local_508,(int)local_5c0,(int)uVar19);
                    lVar11 = local_5a8 + 1;
                    lVar21 = local_640;
                  } while (lVar11 < local_688);
                }
                lVar11 = local_5d0 + 1;
              } while (lVar11 != lVar21);
            }
          }
          if (lVar29 < local_5c0) {
            pnga_pgroup_sync(lVar25);
          }
          if (local_59c != 0) {
            alStack_68[lVar29] = local_678 * 2;
          }
          lVar29 = lVar29 + 1;
        } while (lVar29 != lVar30);
      }
    }
    free(local_5d8);
    free(local_638);
  }
  return;
}

Assistant:

void pnga_update1_ghosts(Integer g_a)
{
  Integer idx, ipx, inx, i, np, handle=GA_OFFSET + g_a, proc_rem;
  Integer size, ndim, nwidth, offset, slice, increment[MAXDIM];
  Integer width[MAXDIM];
  Integer dims[MAXDIM], imax=0;
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_loc[MAXDIM]/*, phi_loc[MAXDIM]*/;
  Integer lo_rem[MAXDIM], hi_rem[MAXDIM];
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer slo_rem[MAXDIM], shi_rem[MAXDIM];
  Integer plo_rem[MAXDIM], phi_rem[MAXDIM];
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  int corner_flag;
  int stride_loc[MAXDIM], stride_rem[MAXDIM], count[MAXDIM];
  char *ptr_loc, *ptr_rem;
  logical hasData = TRUE;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

 /* This routine makes use of the shift algorithm to update data in the
   * ghost cells bounding the local block of visible data. The shift
   * algorithm starts by updating the blocks of data along the first
   * dimension by grabbing a block of data that is width[0] deep but
   * otherwise matches the  dimensions of the data residing on the
   * calling processor. The update of the second dimension, however,
   * grabs a block that is width[1] deep in the second dimension but is
   * ldim0 + 2*width[0] in the first dimensions where ldim0 is the
   * size of the visible data along the first dimension. The remaining
   * dimensions are left the same. For the next update, the width of the
   * second dimension is also increased by 2*width[1] and so on. This
   * algorith makes use of the fact that data for the dimensions that
   * have already been updated is available on each processor and can be
   * used in the updates of subsequent dimensions. The total number of
   * separate updates is 2*ndim, an update in the negative and positive
   * directions for each dimension.
   *
   * To perform the update, this routine makes use of several copies of
   * indices marking the upper and lower limits of data. Indices
   * beginning with the character "p" are relative indices marking the
   * location of the data set relative to the origin the local patch of
   * the global array, all other indices are in absolute coordinates and
   * mark locations in the total global array. The indices used by this
   * routine are described below.
   *
   *       lo_loc[], hi_loc[]: The lower and upper indices of the visible
   *       block of data held by the calling processor.
   *
   *       lo_rem[], hi_rem[]: The lower and upper indices of the block
   *       of data on a remote processor or processors that is needed to
   *       fill in the calling processors ghost cells. These indices are
   *       NOT corrected for wrap-around (periodic) boundary conditions
   *       so they can be negative or greater than the array dimension
   *       values held in dims[].
   *
   *       slo_rem[], shi_rem[]: Similar to lo_rem[] and hi_rem[], except
   *       that these indices have been corrected for wrap-around
   *       boundary conditions. If lo_rem[] and hi_rem[] cross a global
   *        array boundary, as opposed to being entirely located on one
   *       side or the other of the array, then two sets of slo_rem[] and
   *       shi_rem[] will be created. One set will correspond to the
   *       block of data on one side of the global array boundary and the
   *       other set will correspond to the remaining block. This
   *       situation will only occur if the value of the ghost cell width
   *       is greater than the dimension of the visible global array
   *       data on a single processor.
   *
   *       thi_rem[], thi_rem[]: The lower and upper indices of the visible
   *       data on a remote processor.
   *
   *       plo_loc[], phi_loc[]: The indices of the local data patch that
   *       is going to be updated.
   *
   *       plo_rem[], phi_rem[]: The indices of the data patch on the
   *       remote processor that will be used to update the data on the
   *       calling processor. Note that the dimensions of the patches
   *       represented by plo_loc[], plo_rem[] and plo_loc[], phi_loc[]
   *       must be the same.
   *
   * For the case where the width of the ghost cells is more than the
   * width of the visible data held on a processor, special problems
   * arise. It now takes several updates to fill in one block of boundary
   * data and it is now necessary to keep track of where each of these
   * blocks of data go in the ghost cell region. To do this two extra
   * variables are needed. These are offset and slice. Slice is equal to
   * the width of the visible data along the dimension being updated
   * minus one coming from the remote processor. Offset is the amount
   * that this data must be moved inward from the lower boundary of the
   * ghost cell region. Another variable that is also used to handle
   * this case is imax. If this variable is set to 2, then this means
   * that the block of data that is needed to update the ghost cells
   * crosses a global array boundary and the block needs to be broken
   * up into two pieces. */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return;

  _ga_map = malloc((GAnproc*2*MAXDIM +1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_update1_ghosts:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_update1_ghosts:malloc failed (_ga_proclist)",0);

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  corner_flag = GA[handle].corner_flag;
  p_handle = GA[handle].p_handle;

  /* Get pointer to local memory */
  ptr_loc = GA[handle].ptr[me];
  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);
  /* initialize range increments and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    increment[idx] = 0;
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
    if (lo_loc[idx] == 0 && hi_loc[idx] == -1) hasData = FALSE;
  }

  /* loop over dimensions for sequential update using shift algorithm */
  for (idx=0; idx < ndim; idx++) {
    nwidth = (Integer)width[idx];

    /* Do not bother with update if nwidth is zero or processor has
       no data */
    if (nwidth != 0 && hasData) {

      /* Perform update in negative direction. Start by getting rough
         estimate of block of needed data*/
      for (i = 0; i < ndim; i++) {
        if (i == idx) {
          lo_rem[i] = lo_loc[i] - nwidth;
          hi_rem[i] = lo_loc[i] - 1;
          /* Check to see if we will need to update ghost cells using
             one or two major patches of the global array. */
          if (lo_rem[i] < 1) {
            if (hi_rem[i] > 0) {
              imax = 2;
            } else {
              imax = 1;
            }
          } else {
            imax = 1;
          }
        } else {
          lo_rem[i] = lo_loc[i];
          hi_rem[i] = hi_loc[i];
        }
      }

      for (inx = 0; inx < imax; inx++) {
        /* Check to see if boundary is being updated in one patch or two,
           adjust lower boundary accordingly. */
        for (i=0; i<ndim; i++) {
          if (imax == 2 && i == idx) {
            if (inx == 0) {
              slo_rem[i] = 1;
              shi_rem[i] = hi_rem[i];
            } else {
              slo_rem[i] = lo_rem[i] + dims[i];
              shi_rem[i] = dims[i];
            }
          } else if (i == idx) {
            if (lo_rem[i] < 1) {
              slo_rem[i] = dims[i] - nwidth + 1;
              shi_rem[i] = dims[i];
            } else {
              slo_rem[i] = lo_rem[i];
              shi_rem[i] = hi_rem[i];
            }
          } else {
            slo_rem[i] = lo_rem[i];
            shi_rem[i] = hi_rem[i];
          }
        }
        /* locate processor with this data */
        if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
            _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
            slo_rem, shi_rem, g_a);

        for (ipx = 0; ipx < np; ipx++) {
          /* Get actual coordinates of desired chunk of remote
             data as well as the actual coordinates of the local chunk
             of data that will receive the remote data (these
             coordinates take into account the presence of ghost
             cells). Start by finding out what data is actually held by
             remote processor. */
          proc_rem = _ga_proclist[ipx];
          pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
          for (i = 0; i < ndim; i++) {
            if (increment[i] == 0) {
              if (i == idx) {
                if (np == 1 && imax == 1) {
                  plo_rem[i] = thi_rem[i] - tlo_rem[i] + 1;
                  phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
                  plo_loc[i] = 0;
                  /*phi_loc[i] = width[i] - 1;*/
                } else {
                  if (tlo_rem[i] >= slo_rem[i]) {
                    offset = tlo_rem[i] - lo_rem[i];
                    slice = thi_rem[i] - tlo_rem[i];
                  } else {
                    offset = 0;
                    slice = thi_rem[i] - slo_rem[i];
                  }
                  if (offset < 0) offset = offset + dims[i];
                  if (offset >= dims[i]) offset = offset - dims[i];
                  plo_rem[i] = thi_rem[i] - tlo_rem[i] + width[i] - slice;
                  phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
                  plo_loc[i] = offset;
                  /*phi_loc[i] = offset + slice;*/
                }
              } else {
                plo_rem[i] = width[i];
                phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
                plo_loc[i] = width[i];
                /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
              }
            } else {
              plo_rem[i] = 0;
              phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
              plo_loc[i] = 0;
              /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
            }
          }

          /* Get pointer to local data buffer and remote data
             buffer as well as lists of leading dimenstions */
          gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
          gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

          /* Evaluate strides on local and remote processors */
          gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
              stride_loc);

          /* Compute the number of elements in each dimension and store
             result in count. Scale the first element in count by the
             element size. */
          gam_ComputeCount(ndim, plo_rem, phi_rem, count);
          count[0] *= size;
 
          /* get remote data */
          if (p_handle >= 0) {
            proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
          }
          ARMCI_GetS(ptr_rem, stride_rem, ptr_loc, stride_loc, count,
              (int)(ndim - 1), (int)proc_rem);
        }
      }

      /* Perform update in positive direction. Start by getting rough
         estimate of block of needed data*/
      for (i = 0; i < ndim; i++) {
        if (i == idx) {
          lo_rem[i] = hi_loc[i] + 1;
          hi_rem[i] = hi_loc[i] + nwidth;
          /* Check to see if we will need to update ghost cells using
             one or two major patches of the global array. */
          if (hi_rem[i] > dims[i]) {
            if (lo_rem[i] <= dims[i]) {
              imax = 2;
            } else {
              imax = 1;
            }
          } else {
            imax = 1;
          }
        } else {
          lo_rem[i] = lo_loc[i];
          hi_rem[i] = hi_loc[i];
        }
      }

      for (inx = 0; inx < imax; inx++) {
        /* Check to see if boundary is being updated in one patch or two,
           adjust lower boundary accordingly. */
        for (i=0; i<ndim; i++) {
          if (imax == 2 && i == idx) {
            if (inx == 0) {
              slo_rem[i] = lo_rem[i];
              shi_rem[i] = dims[i];
            } else {
              slo_rem[i] = 1;
              shi_rem[i] = hi_rem[i] - dims[i];
            }
          } else if (i == idx) {
            if (hi_rem[i] > dims[i]) {
              slo_rem[i] = 1;
              shi_rem[i] = nwidth;
            } else {
              slo_rem[i] = lo_rem[i];
              shi_rem[i] = hi_rem[i];
            }
          } else {
            slo_rem[i] = lo_rem[i];
            shi_rem[i] = hi_rem[i];
          }
        }
        /* locate processor with this data */
        if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
            _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
            slo_rem, shi_rem, g_a);

        for (ipx = 0; ipx < np; ipx++) {
          /* Get actual coordinates of desired chunk of remote
             data as well as the actual coordinates of the local chunk
             of data that will receive the remote data (these
             coordinates take into account the presence of ghost
             cells). Start by finding out what data is actually held by
             remote processor. */
          proc_rem = _ga_proclist[ipx];
          pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
          for (i = 0; i < ndim; i++) {
            if (increment[i] == 0) {
              if (i == idx) {
                if (np == 1 && imax == 1) {
                  plo_rem[i] = width[i];
                  phi_rem[i] = 2*width[i] - 1;
                  plo_loc[i] = hi_loc[i] - lo_loc[i] + 1 + width[i];
                  /*phi_loc[i] = hi_loc[i] - lo_loc[i] + 2*width[i];*/
                } else {
                  offset = tlo_rem[i] - hi_loc[i] - 1;
                  if (thi_rem[i] <= shi_rem[i]) {
                    slice = thi_rem[i] - tlo_rem[i];
                  } else {
                    slice = shi_rem[i] - tlo_rem[i];
                  }
                  if (offset < 0) offset = offset + dims[i];
                  if (offset >= dims[i]) offset = offset - dims[i];
                  plo_rem[i] = width[i];
                  phi_rem[i] = width[i] + slice;
                  plo_loc[i] = hi_loc[i] - lo_loc[i] + width[i] + 1 + offset;
                  /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i] + 1
                    + offset + slice;*/
                }
              } else {
                plo_rem[i] = width[i];
                phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
                plo_loc[i] = width[i];
                /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
              }
            } else {
              plo_rem[i] = 0;
              phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
              plo_loc[i] = 0;
              /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
            }
          }

          /* Get pointer to local data buffer and remote data
             buffer as well as lists of leading dimenstions */
          gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
          gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

          /* Evaluate strides on local and remote processors */
          gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
              stride_loc);

          /* Compute the number of elements in each dimension and store
             result in count. Scale the first element in count by the
             element size. */
          gam_ComputeCount(ndim, plo_rem, phi_rem, count);
          count[0] *= size;
 
          /* get remote data */
          if (p_handle >= 0) {
            proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
          }
          ARMCI_GetS(ptr_rem, stride_rem, ptr_loc, stride_loc, count,
              (int)(ndim - 1), (int)proc_rem);
        }
      }
    }
    /* synchronize all processors and update increment array */
    if (idx < ndim-1) pnga_pgroup_sync(p_handle);
    if (corner_flag)
      increment[idx] = 2*nwidth;
  }

  free(_ga_map);
  free(_ga_proclist);
}